

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.cpp
# Opt level: O2

void Am_Wait(int milliseconds)

{
  timeval tim;
  timeval local_10;
  
  local_10.tv_sec = (__time_t)(milliseconds / 1000);
  local_10.tv_usec = (__suseconds_t)((milliseconds % 1000) * 1000);
  select(0,(fd_set *)0x0,(fd_set *)0x0,(fd_set *)0x0,&local_10);
  return;
}

Assistant:

void
Am_Wait(int milliseconds)
{
  timeval tim;
  tim.tv_sec = milliseconds / 1000;
  tim.tv_usec = (milliseconds % 1000) * 1000;
  // Use select to hack a subsecond pause on UNIX.
  // There's no machine independent way to pause for a fraction of a second.
  // select usually does something, but nullptrs say, "do nothing."
  // tim tells it how long to do nothing.
  select(0, nullptr, nullptr, nullptr, &tim);
}